

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseLookupGt(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  
  pxVar1 = ctxt->input;
  uVar5 = ctxt->endCheckState;
  pbVar3 = pxVar1->cur + ctxt->checkIndex + (ulong)(ctxt->checkIndex == 0);
  pbVar2 = pbVar3;
  do {
    if (pxVar1->end <= pbVar3) {
      lVar4 = (long)pbVar2 - (long)pxVar1->cur;
      lVar6 = 0;
      if (0 < lVar4) {
        lVar6 = lVar4;
      }
      if (lVar4 < 0) {
        uVar5 = 0;
      }
      uVar7 = (uint)((ulong)lVar4 >> 0x3f);
LAB_00144240:
      ctxt->checkIndex = lVar6;
      ctxt->endCheckState = uVar5;
      return uVar7;
    }
    if (uVar5 == 0) {
      uVar7 = (uint)*pbVar3;
      uVar5 = uVar7;
      if (((uVar7 != 0x22) && (uVar7 != 0x27)) && (uVar5 = 0, uVar7 == 0x3e)) {
        uVar7 = 1;
        lVar6 = 0;
        uVar5 = 0;
        goto LAB_00144240;
      }
    }
    else if (uVar5 == *pbVar3) {
      uVar5 = 0;
    }
    pbVar3 = pbVar3 + 1;
    pbVar2 = pxVar1->end;
  } while( true );
}

Assistant:

static int
xmlParseLookupGt(xmlParserCtxtPtr ctxt) {
    const xmlChar *cur;
    const xmlChar *end = ctxt->input->end;
    int state = ctxt->endCheckState;
    size_t index;

    if (ctxt->checkIndex == 0)
        cur = ctxt->input->cur + 1;
    else
        cur = ctxt->input->cur + ctxt->checkIndex;

    while (cur < end) {
        if (state) {
            if (*cur == state)
                state = 0;
        } else if (*cur == '\'' || *cur == '"') {
            state = *cur;
        } else if (*cur == '>') {
            ctxt->checkIndex = 0;
            ctxt->endCheckState = 0;
            return(1);
        }
        cur++;
    }

    index = cur - ctxt->input->cur;
    if (index > LONG_MAX) {
        ctxt->checkIndex = 0;
        ctxt->endCheckState = 0;
        return(1);
    }
    ctxt->checkIndex = index;
    ctxt->endCheckState = state;
    return(0);
}